

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<char16_t,_const_QString_&> *b)

{
  ArrayOptions *pAVar1;
  char16_t *pcVar2;
  ulong uVar3;
  Data *pDVar4;
  long lVar5;
  ulong uVar6;
  char16_t *__src;
  long lVar7;
  ulong uVar8;
  
  pDVar4 = (a->d).d;
  uVar6 = (a->d).size;
  uVar8 = uVar6 + (b->b->d).size + 1;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)uVar6);
    pDVar4 = (a->d).d;
    uVar6 = (a->d).size;
    uVar3 = uVar8;
    if (pDVar4 != (Data *)0x0) goto LAB_004aed42;
LAB_004aed8a:
    if (uVar3 < uVar6) {
      uVar3 = uVar6;
    }
    QString::reallocData((longlong)a,(AllocationOption)uVar3);
    pDVar4 = (a->d).d;
    if (pDVar4 != (Data *)0x0) {
      lVar5 = (pDVar4->super_QArrayData).alloc;
LAB_004aedad:
      if (lVar5 != 0) {
        pAVar1 = &(pDVar4->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_004aedb6;
    }
  }
  else {
LAB_004aed42:
    lVar5 = (pDVar4->super_QArrayData).alloc;
    lVar7 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((long)((lVar5 - uVar6) - lVar7) < (long)uVar8) {
      uVar3 = lVar5 * 2;
      if (lVar5 * 2 < (long)uVar8) {
        uVar3 = uVar8;
      }
      if ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar5 - lVar7 <= (long)uVar3)) goto LAB_004aed8a;
      goto LAB_004aedad;
    }
LAB_004aedb6:
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_004aedce;
  }
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_004aedce:
  pcVar2 = (a->d).ptr + (a->d).size;
  *pcVar2 = b->a;
  lVar5 = (b->b->d).size;
  if (lVar5 != 0) {
    __src = (b->b->d).ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar2 + 1,__src,lVar5 * 2);
  }
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}